

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> __thiscall
kj::anon_unknown_30::SocketAddress::lookupHost
          (SocketAddress *this,LowLevelAsyncIoProvider *lowLevel,String *host,String *service,
          uint portHint,NetworkFilter *filter)

{
  Thread *pTVar1;
  NetworkFilter *pNVar2;
  _func_int **pp_Var3;
  ArrayDisposer *pAVar4;
  Iface *pIVar5;
  Fault FVar6;
  undefined8 uVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  Thread *this_00;
  Disposer *pDVar11;
  AttachmentPromiseNodeBase *this_01;
  Disposer *pDVar12;
  void *__buf;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *pPVar13;
  LookupReader *ptrCopy;
  Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> PVar14;
  Thread *ptrCopy_2;
  Own<kj::AsyncInputStream> input;
  LookupParams params;
  int fds [2];
  Disposer local_d8;
  _func_int **local_d0;
  Function<void_()> local_c8;
  Fault local_b8;
  undefined8 uStack_b0;
  uchar local_a8 [8];
  long local_a0;
  undefined8 uStack_98;
  ArrayDisposer *local_90;
  undefined1 local_88 [40];
  Disposer *pDStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = filter;
  local_38 = this;
  do {
    iVar10 = ::pipe2(&stack0xffffffffffffffb8,0x80800);
    if (-1 < iVar10) {
      iVar10 = 0;
      break;
    }
    iVar10 = _::Debug::getOsErrorNumber(false);
  } while (iVar10 == -1);
  if (iVar10 == 0) {
    (**lowLevel->_vptr_LowLevelAsyncIoProvider)(&local_d8,lowLevel,(ulong)(uint)local_48,7);
    pTVar1 = (Thread *)(host->content).ptr;
    pDVar12 = (Disposer *)(host->content).size_;
    local_a8 = (uchar  [8])(host->content).disposer;
    (host->content).ptr = (char *)0x0;
    (host->content).size_ = 0;
    pNVar2 = (NetworkFilter *)(service->content).ptr;
    pp_Var3 = (_func_int **)(service->content).size_;
    pAVar4 = (service->content).disposer;
    (service->content).ptr = (char *)0x0;
    (service->content).size_ = 0;
    local_b8.exception = (Exception *)0x0;
    uStack_b0 = 0;
    local_a0 = 0;
    uStack_98 = 0;
    local_90 = pAVar4;
    local_88._0_8_ = (Disposer *)CONCAT44(portHint,local_44);
    local_88._8_8_ = pTVar1;
    local_88._16_8_ = pDVar12;
    local_88._24_8_ = local_a8;
    local_88._32_8_ = pNVar2;
    pDStack_60 = (Disposer *)pp_Var3;
    local_58 = pAVar4;
    local_50 = local_a8;
    this_00 = (Thread *)operator_new(0x18);
    local_c8.impl.ptr = (Iface *)operator_new(0x40);
    (local_c8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00469900;
    local_c8.impl.ptr[1]._vptr_Iface = (_func_int **)CONCAT44(portHint,local_44);
    local_c8.impl.ptr[2]._vptr_Iface = (_func_int **)pTVar1;
    local_c8.impl.ptr[3]._vptr_Iface = (_func_int **)pDVar12;
    local_c8.impl.ptr[4]._vptr_Iface = (_func_int **)local_50;
    local_88._8_8_ = (Thread *)0x0;
    local_88._16_8_ = (Disposer *)0x0;
    local_c8.impl.ptr[5]._vptr_Iface = (_func_int **)pNVar2;
    local_c8.impl.ptr[6]._vptr_Iface = pp_Var3;
    local_c8.impl.ptr[7]._vptr_Iface = (_func_int **)pAVar4;
    local_88._32_8_ = (NetworkFilter *)0x0;
    pDStack_60 = (Disposer *)0x0;
    pDVar12 = (Disposer *)
              &_::
               HeapDisposer<kj::Function<void()>::Impl<kj::CaptureByMove<kj::(anonymous_namespace)::SocketAddress::lookupHost(kj::LowLevelAsyncIoProvider&,kj::String,kj::String,unsigned_int,kj::_::NetworkFilter&)::$_1,kj::(anonymous_namespace)::SocketAddress::LookupParams>>>
               ::instance;
    local_c8.impl.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::Function<void()>::Impl<kj::CaptureByMove<kj::(anonymous_namespace)::SocketAddress::lookupHost(kj::LowLevelAsyncIoProvider&,kj::String,kj::String,unsigned_int,kj::_::NetworkFilter&)::$_1,kj::(anonymous_namespace)::SocketAddress::LookupParams>>>
          ::instance;
    Thread::Thread(this_00,&local_c8);
    pIVar5 = local_c8.impl.ptr;
    if (local_c8.impl.ptr != (Iface *)0x0) {
      local_c8.impl.ptr = (Iface *)0x0;
      (**(local_c8.impl.disposer)->_vptr_Disposer)
                (local_c8.impl.disposer,pIVar5->_vptr_Iface[-2] + (long)&pIVar5->_vptr_Iface);
    }
    pDVar11 = pDStack_60;
    uVar7 = local_88._32_8_;
    if ((NetworkFilter *)local_88._32_8_ != (NetworkFilter *)0x0) {
      local_88._32_8_ = (NetworkFilter *)0x0;
      pDStack_60 = (Disposer *)0x0;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,uVar7,1,pDVar11,pDVar11,0);
      pDVar12 = pDVar11;
    }
    pDVar11 = (Disposer *)local_88._16_8_;
    uVar7 = local_88._8_8_;
    if ((Thread *)local_88._8_8_ != (Thread *)0x0) {
      local_88._8_8_ = (Thread *)0x0;
      local_88._16_8_ = (Disposer *)0x0;
      (***(_func_int ***)local_50)(local_50,uVar7,1,pDVar11,pDVar11,0);
      pDVar12 = pDVar11;
    }
    pDVar11 = (Disposer *)operator_new(0x100);
    pDVar11->_vptr_Disposer = (_func_int **)&_::HeapDisposer<kj::Thread>::instance;
    pDVar11[1]._vptr_Disposer = (_func_int **)this_00;
    pDVar11[2]._vptr_Disposer = local_d8._vptr_Disposer;
    pDVar11[3]._vptr_Disposer = local_d0;
    local_d0 = (_func_int **)0x0;
    pDVar11[4]._vptr_Disposer = (_func_int **)local_40;
    *(undefined4 *)&pDVar11[0x1b]._vptr_Disposer = 0;
    pDVar11[0x1c]._vptr_Disposer = (_func_int **)0x0;
    memset(pDVar11 + 5,0,0xa0);
    pDVar11[0x1d]._vptr_Disposer = (_func_int **)(pDVar11 + 0x1b);
    pDVar11[0x1e]._vptr_Disposer = (_func_int **)(pDVar11 + 0x1b);
    pDVar11[0x1f]._vptr_Disposer = (_func_int **)0x0;
    LookupReader::read((LookupReader *)local_88,(int)pDVar11,__buf,(size_t)pDVar12);
    uVar9 = local_38;
    this_01 = (AttachmentPromiseNodeBase *)operator_new(0x28);
    _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
              (this_01,(Own<kj::_::PromiseNode> *)local_88);
    uVar7 = local_88._8_8_;
    (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00469a28;
    this_01[1].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::SocketAddress::LookupReader>::instance;
    this_01[1].dependency.disposer = pDVar11;
    *(undefined8 **)uVar9 =
         &_::
          HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>>
          ::instance;
    *(AttachmentPromiseNodeBase **)(uVar9 + 8) = this_01;
    pPVar13 = extraout_RDX;
    if ((Thread *)local_88._8_8_ != (Thread *)0x0) {
      local_88._8_8_ = (Thread *)0x0;
      (***(_func_int ***)local_88._0_8_)
                (local_88._0_8_,
                 (long)(ThreadState **)uVar7 +
                 *(long *)((long)&(*(ThreadState **)uVar7)[-1].exception.ptr.field_1 + 0x150));
      pPVar13 = extraout_RDX_00;
    }
    uVar7 = uStack_98;
    lVar8 = local_a0;
    if (local_a0 != 0) {
      local_a0 = 0;
      uStack_98 = 0;
      (**local_90->_vptr_ArrayDisposer)(local_90,lVar8,1,uVar7,uVar7,0);
      pPVar13 = extraout_RDX_01;
    }
    uVar7 = uStack_b0;
    FVar6.exception = local_b8.exception;
    if (local_b8.exception != (Exception *)0x0) {
      local_b8.exception = (Exception *)0x0;
      uStack_b0 = 0;
      (***(_func_int ***)local_a8)(local_a8,FVar6.exception,1,uVar7,uVar7,0);
      pPVar13 = extraout_RDX_02;
    }
    pp_Var3 = local_d0;
    if (local_d0 != (_func_int **)0x0) {
      local_d0 = (_func_int **)0x0;
      (**(code **)*local_d8._vptr_Disposer)
                (local_d8._vptr_Disposer,(long)pp_Var3 + *(long *)((long)*pp_Var3 + -0x10));
      pPVar13 = extraout_RDX_03;
    }
    PVar14.super_PromiseBase.node.ptr = pPVar13;
    PVar14.super_PromiseBase.node.disposer = (Disposer *)uVar9;
    return (Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>)
           PVar14.super_PromiseBase.node;
  }
  local_b8.exception = (Exception *)0x0;
  local_88._0_8_ = (Disposer *)0x0;
  local_88._8_8_ = (Thread *)0x0;
  _::Debug::Fault::init
            (&local_b8,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  _::Debug::Fault::fatal(&local_b8);
}

Assistant:

Promise<Array<SocketAddress>> SocketAddress::lookupHost(
    LowLevelAsyncIoProvider& lowLevel, kj::String host, kj::String service, uint portHint,
    _::NetworkFilter& filter) {
  // This shitty function spawns a thread to run getaddrinfo().  Unfortunately, getaddrinfo() is
  // the only cross-platform DNS API and it is blocking.
  //
  // TODO(perf):  Use a thread pool?  Maybe kj::Thread should use a thread pool automatically?
  //   Maybe use the various platform-specific asynchronous DNS libraries?  Please do not implement
  //   a custom DNS resolver...

  int fds[2];
#if __linux__ && !__BIONIC__
  KJ_SYSCALL(pipe2(fds, O_NONBLOCK | O_CLOEXEC));
#else
  KJ_SYSCALL(pipe(fds));
#endif

  auto input = lowLevel.wrapInputFd(fds[0], NEW_FD_FLAGS);

  int outFd = fds[1];

  LookupParams params = { kj::mv(host), kj::mv(service) };

  auto thread = heap<Thread>(kj::mvCapture(params, [outFd,portHint](LookupParams&& params) {
    FdOutputStream output((AutoCloseFd(outFd)));

    struct addrinfo* list;
    int status = getaddrinfo(
        params.host == "*" ? nullptr : params.host.cStr(),
        params.service == nullptr ? nullptr : params.service.cStr(),
        nullptr, &list);
    if (status == 0) {
      KJ_DEFER(freeaddrinfo(list));

      struct addrinfo* cur = list;
      while (cur != nullptr) {
        if (params.service == nullptr) {
          switch (cur->ai_addr->sa_family) {
            case AF_INET:
              ((struct sockaddr_in*)cur->ai_addr)->sin_port = htons(portHint);
              break;
            case AF_INET6:
              ((struct sockaddr_in6*)cur->ai_addr)->sin6_port = htons(portHint);
              break;
            default:
              break;
          }
        }

        SocketAddress addr;
        if (params.host == "*") {
          // Set up a wildcard SocketAddress.  Only use the port number returned by getaddrinfo().
          addr.wildcard = true;
          addr.addrlen = sizeof(addr.addr.inet6);
          addr.addr.inet6.sin6_family = AF_INET6;
          switch (cur->ai_addr->sa_family) {
            case AF_INET:
              addr.addr.inet6.sin6_port = ((struct sockaddr_in*)cur->ai_addr)->sin_port;
              break;
            case AF_INET6:
              addr.addr.inet6.sin6_port = ((struct sockaddr_in6*)cur->ai_addr)->sin6_port;
              break;
            default:
              addr.addr.inet6.sin6_port = portHint;
              break;
          }
        } else {
          addr.addrlen = cur->ai_addrlen;
          memcpy(&addr.addr.generic, cur->ai_addr, cur->ai_addrlen);
        }
        KJ_ASSERT_CAN_MEMCPY(SocketAddress);
        output.write(&addr, sizeof(addr));
        cur = cur->ai_next;
      }
    } else if (status == EAI_SYSTEM) {
      KJ_FAIL_SYSCALL("getaddrinfo", errno, params.host, params.service) {
        return;
      }
    } else {
      KJ_FAIL_REQUIRE("DNS lookup failed.",
                      params.host, params.service, gai_strerror(status)) {
        return;
      }
    }
  }));

  auto reader = heap<LookupReader>(kj::mv(thread), kj::mv(input), filter);
  return reader->read().attach(kj::mv(reader));
}